

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O3

void __thiscall Am_Object_Data::invoke_create_demons(Am_Object_Data *this)

{
  uint *puVar1;
  Am_Object_Demon *pAVar2;
  Am_Object_Data *this_00;
  Am_Object local_18;
  
  for (this_00 = this->first_part; this_00 != (Am_Object_Data *)0x0; this_00 = this_00->next_part) {
    invoke_create_demons(this_00);
  }
  if (((short)this->demons_active < 0) &&
     (pAVar2 = this->demon_set->create_demon, pAVar2 != (Am_Object_Demon *)0x0)) {
    puVar1 = &(this->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    local_18.data = this;
    (*pAVar2)((Am_Object_Data *)&local_18);
    Am_Object::~Am_Object(&local_18);
  }
  return;
}

Assistant:

void
Am_Object_Data::invoke_create_demons()
{
  Am_Object_Data *curr_part;
  for (curr_part = first_part; curr_part != nullptr;
       curr_part = curr_part->next_part)
    curr_part->invoke_create_demons();
  if ((demons_active & DEMONS_ACTIVE) && demon_set->create_demon) {
    Note_Reference();
    demon_set->create_demon(Am_Object(this));
  }
}